

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O0

void __thiscall CaDiCaL::Proof::conclude_sat(Proof *this,vector<int,_std::allocator<int>_> *model)

{
  bool bVar1;
  undefined8 in_RSI;
  vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_> *in_RDI;
  Tracer **tracer;
  iterator __end1;
  iterator __begin1;
  vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_> *__range1;
  __normal_iterator<CaDiCaL::Tracer_**,_std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<CaDiCaL::Tracer_**,_std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>_>
  local_20;
  vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_> *local_18;
  undefined8 local_10;
  
  local_18 = in_RDI + 3;
  local_10 = in_RSI;
  local_20._M_current =
       (Tracer **)std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>::begin(in_RDI);
  std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffd0,
                       (__normal_iterator<CaDiCaL::Tracer_**,_std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         (__normal_iterator<CaDiCaL::Tracer_**,_std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>_>
          *)__gnu_cxx::
            __normal_iterator<CaDiCaL::Tracer_**,_std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>_>
            ::operator*(&local_20);
    (*((Tracer *)in_stack_ffffffffffffffd0->_M_current)->_vptr_Tracer[0x10])
              ((Tracer *)in_stack_ffffffffffffffd0->_M_current,local_10);
    __gnu_cxx::
    __normal_iterator<CaDiCaL::Tracer_**,_std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void Proof::conclude_sat (const vector<int> &model) {
  LOG (clause, "PROOF conclude sat");
  for (auto &tracer : tracers) {
    tracer->conclude_sat (model);
  }
}